

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilTruth.c
# Opt level: O2

void Extra_TruthStretch(uint *pOut,uint *pIn,int nVars,int nVarsAll,uint Phase)

{
  uint *puVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  int iVar;
  
  bVar3 = false;
  uVar2 = nVarsAll;
  do {
    iVar4 = nVars + -1;
    do {
      if ((int)uVar2 < 1) {
        if (nVars != 0) {
          __assert_fail("Var == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilTruth.c"
                        ,0xf9,
                        "void Extra_TruthStretch(unsigned int *, unsigned int *, int, int, unsigned int)"
                       );
        }
        if (bVar3) {
          return;
        }
        Extra_TruthCopy(pOut,pIn,nVarsAll);
        return;
      }
      uVar2 = uVar2 - 1;
      puVar1 = pIn;
      iVar = iVar4;
    } while ((Phase >> (uVar2 & 0x1f) & 1) == 0);
    for (; pIn = puVar1, nVars = iVar4, iVar < (int)uVar2; iVar = iVar + 1) {
      Extra_TruthSwapAdjacentVars(pOut,pIn,nVarsAll,iVar);
      bVar3 = (bool)(bVar3 ^ 1);
      puVar1 = pOut;
      pOut = pIn;
    }
  } while( true );
}

Assistant:

void Extra_TruthStretch( unsigned * pOut, unsigned * pIn, int nVars, int nVarsAll, unsigned Phase )
{
    unsigned * pTemp;
    int i, k, Var = nVars - 1, Counter = 0;
    for ( i = nVarsAll - 1; i >= 0; i-- )
        if ( Phase & (1 << i) )
        {
            for ( k = Var; k < i; k++ )
            {
                Extra_TruthSwapAdjacentVars( pOut, pIn, nVarsAll, k );
                pTemp = pIn; pIn = pOut; pOut = pTemp;
                Counter++;
            }
            Var--;
        }
    assert( Var == -1 );
    // swap if it was moved an even number of times
    if ( !(Counter & 1) )
        Extra_TruthCopy( pOut, pIn, nVarsAll );
}